

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testExtendByBox<Imath_3_2::Vec2<long>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  size_type sVar7;
  reference v;
  long *plVar8;
  long *__b;
  char *in_RDI;
  float fVar9;
  uint k_1;
  uint k;
  Vec2<long> p1_1;
  Vec2<long> p0_1;
  uint i_1;
  Vec2<long> max;
  Vec2<long> min;
  Box<Imath_3_2::Vec2<long>_> b_1;
  uint iters;
  Rand32 rand;
  Box<Imath_3_2::Vec2<long>_> b1;
  Box<Imath_3_2::Vec2<long>_> b0;
  Vec2<long> p1;
  Vec2<long> p0;
  uint j;
  uint i;
  vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_> perms;
  Box<Imath_3_2::Vec2<long>_> b;
  float in_stack_fffffffffffffda8;
  float in_stack_fffffffffffffdac;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  Vec2<long> *in_stack_fffffffffffffdb8;
  Box<Imath_3_2::Vec2<long>_> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdf0;
  undefined2 in_stack_fffffffffffffdf4;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  bool bVar10;
  bool local_1d9;
  uint local_1b8;
  uint local_1b4;
  Vec2<long> local_1b0;
  Vec2<long> local_1a0;
  uint local_18c;
  Vec2<long> local_188;
  Vec2<long> local_178;
  Vec2<long> local_168;
  Vec2<long> VStack_158;
  undefined4 local_144;
  Vec2<long> local_118;
  Vec2<long> aVStack_108 [3];
  Vec2<long> local_d8;
  Vec2<long> VStack_c8;
  Vec2<long> local_b8;
  Vec2<long> local_a8;
  uint local_94;
  uint local_90;
  vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_> local_80;
  Vec2<long> local_68;
  Vec2<long> local_58 [3];
  Vec2<long> local_28;
  Vec2<long> VStack_18;
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
            ((Box<Imath_3_2::Vec2<long>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
            ((Box<Imath_3_2::Vec2<long>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  Imath_3_2::Box<Imath_3_2::Vec2<long>_>::extendBy
            ((Box<Imath_3_2::Vec2<long>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             (Box<Imath_3_2::Vec2<long>_> *)
             CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  lVar5 = Imath_3_2::Vec2<long>::baseTypeMax();
  Imath_3_2::Vec2<long>::Vec2(local_58,lVar5);
  bVar1 = Imath_3_2::Vec2<long>::operator==(&local_28,local_58);
  local_1d9 = false;
  if (bVar1) {
    lVar5 = Imath_3_2::Vec2<long>::baseTypeLowest();
    Imath_3_2::Vec2<long>::Vec2(&local_68,lVar5);
    local_1d9 = Imath_3_2::Vec2<long>::operator==(&VStack_18,&local_68);
  }
  if (local_1d9 == false) {
    __assert_fail("b.min == T (T::baseTypeMax ()) && b.max == T (T::baseTypeLowest ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,300,
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<long>]"
                 );
  }
  std::vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::vector
            ((vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_> *)0x113e3c);
  permutations<Imath_3_2::Vec2<long>>
            ((vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_> *)
             CONCAT17(in_stack_fffffffffffffdf7,
                      CONCAT16(in_stack_fffffffffffffdf6,
                               CONCAT24(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))));
  local_90 = 0;
  do {
    uVar6 = (ulong)local_90;
    sVar7 = std::vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::size
                      (&local_80);
    if (sVar7 <= uVar6) {
      std::vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::~vector
                ((vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_> *)
                 in_stack_fffffffffffffdc0);
      Imath_3_2::Rand32::Rand32
                ((Rand32 *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      local_144 = 10;
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
                ((Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      Imath_3_2::Vec2<long>::Vec2(&local_178);
      Imath_3_2::Vec2<long>::Vec2(&local_188);
      local_18c = 1;
      while( true ) {
        if (9 < local_18c) {
          return;
        }
        Imath_3_2::Vec2<long>::Vec2(&local_1a0);
        Imath_3_2::Vec2<long>::Vec2(&local_1b0);
        local_1b4 = 0;
        while (uVar3 = local_1b4, uVar2 = Imath_3_2::Vec2<long>::dimensions(), uVar3 < uVar2) {
          fVar9 = Imath_3_2::Rand32::nextf
                            ((Rand32 *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0)
                             ,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
          plVar8 = Imath_3_2::Vec2<long>::operator[](&local_1a0,local_1b4);
          *plVar8 = (long)fVar9;
          fVar9 = Imath_3_2::Rand32::nextf
                            ((Rand32 *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0)
                             ,in_stack_fffffffffffffdac,in_stack_fffffffffffffda8);
          plVar8 = Imath_3_2::Vec2<long>::operator[](&local_1b0,local_1b4);
          *plVar8 = (long)fVar9;
          local_1b4 = local_1b4 + 1;
        }
        Imath_3_2::Vec2<long>::operator=(&local_178,&local_168);
        Imath_3_2::Vec2<long>::operator=(&local_188,&VStack_158);
        for (local_1b8 = 0; uVar3 = Imath_3_2::Vec2<long>::dimensions(), local_1b8 < uVar3;
            local_1b8 = local_1b8 + 1) {
          in_stack_fffffffffffffdb8 =
               (Vec2<long> *)Imath_3_2::Vec2<long>::operator[](&local_178,local_1b8);
          plVar8 = Imath_3_2::Vec2<long>::operator[](&local_1a0,local_1b8);
          plVar8 = std::min<long>(&in_stack_fffffffffffffdb8->x,plVar8);
          in_stack_fffffffffffffdc0 = (Box<Imath_3_2::Vec2<long>_> *)*plVar8;
          plVar8 = Imath_3_2::Vec2<long>::operator[](&local_178,local_1b8);
          *plVar8 = (long)in_stack_fffffffffffffdc0;
          plVar8 = Imath_3_2::Vec2<long>::operator[](&local_188,local_1b8);
          __b = Imath_3_2::Vec2<long>::operator[](&local_1b0,local_1b8);
          plVar8 = std::max<long>(plVar8,__b);
          lVar5 = *plVar8;
          plVar8 = Imath_3_2::Vec2<long>::operator[](&local_188,local_1b8);
          *plVar8 = lVar5;
        }
        Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
                  (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (Vec2<long> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
        Imath_3_2::Box<Imath_3_2::Vec2<long>_>::extendBy
                  ((Box<Imath_3_2::Vec2<long>_> *)
                   CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                   (Box<Imath_3_2::Vec2<long>_> *)
                   CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        bVar1 = Imath_3_2::Vec2<long>::operator==(&local_168,&local_178);
        in_stack_fffffffffffffdb7 = false;
        if (bVar1) {
          in_stack_fffffffffffffdb7 = Imath_3_2::Vec2<long>::operator==(&VStack_158,&local_188);
        }
        if ((bool)in_stack_fffffffffffffdb7 == false) break;
        local_18c = local_18c + 1;
      }
      __assert_fail("b.min == min && b.max == max",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                    ,0x165,
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<long>]"
                   );
    }
    for (local_94 = 0; uVar6 = (ulong)local_94,
        sVar7 = std::vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::size
                          (&local_80), uVar6 < sVar7; local_94 = local_94 + 1) {
      std::vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::operator[]
                (&local_80,(ulong)local_90);
      Imath_3_2::Vec2<long>::operator-
                ((Vec2<long> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      v = std::vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::operator[]
                    (&local_80,(ulong)local_94);
      Imath_3_2::Vec2<long>::Vec2(&local_b8,v);
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
                ((Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (Vec2<long> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::extendBy
                ((Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 (Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      bVar1 = Imath_3_2::Vec2<long>::operator==(&local_d8,&local_a8);
      bVar10 = false;
      if (bVar1) {
        bVar10 = Imath_3_2::Vec2<long>::operator==(&VStack_c8,&local_b8);
      }
      if (bVar10 == false) {
        __assert_fail("b0.min == p0 && b0.max == p1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x13f,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<long>]"
                     );
      }
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (Vec2<long> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::Box
                ((Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
      Imath_3_2::Box<Imath_3_2::Vec2<long>_>::extendBy
                ((Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                 (Box<Imath_3_2::Vec2<long>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      bVar1 = Imath_3_2::Vec2<long>::operator==(&local_118,&local_a8);
      bVar10 = false;
      if (bVar1) {
        bVar10 = Imath_3_2::Vec2<long>::operator==(aVStack_108,&local_b8);
      }
      if (bVar10 == false) {
        __assert_fail("b1.min == p0 && b1.max == p1",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                      ,0x143,
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<long>]"
                     );
      }
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void
testExtendByBox (const char* type)
{
    cout << "    extendBy() box for type " << type << endl;

    //
    // Extend empty box with an empty box;
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> ());
        assert (
            b.min == T (T::baseTypeMax ()) &&
            b.max == T (T::baseTypeLowest ()));
    }

    //
    // Extend empty box with a non-empty box and vice versa.
    //
    {
        std::vector<T> perms;
        permutations (perms);

        for (unsigned int i = 0; i < perms.size (); i++)
        {
            for (unsigned int j = 0; j < perms.size (); j++)
            {
                T p0 = -perms[i];
                T p1 = perms[j];

                IMATH_INTERNAL_NAMESPACE::Box<T> b0;
                b0.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> (p0, p1));
                assert (b0.min == p0 && b0.max == p1);

                IMATH_INTERNAL_NAMESPACE::Box<T> b1 (p0, p1);
                b1.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> ());
                assert (b1.min == p0 && b1.max == p1);
            }
        }
    }

    //
    // Extend non-empty box with non-empty box. Starts with empty, then builds.
    //
    IMATH_INTERNAL_NAMESPACE::Rand32 rand (0);
    const unsigned int               iters = 10;
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;

        T min, max;

        for (unsigned int i = 1; i < iters; i++)
        {
            T p0;
            T p1;
            for (unsigned int k = 0; k < T::dimensions (); k++)
            {
                p0[k] = typename T::BaseType (rand.nextf (0, 999));
                p1[k] = typename T::BaseType (rand.nextf (1000, 1999));
            }

            min = b.min;
            max = b.max;
            for (unsigned int k = 0; k < T::dimensions (); k++)
            {
                min[k] = std::min (min[k], p0[k]);
                max[k] = std::max (max[k], p1[k]);
            }
            b.extendBy (IMATH_INTERNAL_NAMESPACE::Box<T> (p0, p1));

            assert (b.min == min && b.max == max);
        }
    }
}